

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zsp_blas3.c
# Opt level: O0

int sp_zgemm(char *transa,char *transb,int m,int n,int k,doublecomplex alpha,SuperMatrix *A,
            doublecomplex *b,int ldb,doublecomplex beta,doublecomplex *c,int ldc)

{
  int local_5c;
  int j;
  int incy;
  int incx;
  SuperMatrix *A_local;
  int k_local;
  int n_local;
  int m_local;
  char *transb_local;
  char *transa_local;
  doublecomplex beta_local;
  doublecomplex alpha_local;
  
  for (local_5c = 0; local_5c < n; local_5c = local_5c + 1) {
    sp_zgemv(transa,alpha,A,b + ldb * local_5c,1,beta,c + ldc * local_5c,1);
  }
  return 0;
}

Assistant:

int
sp_zgemm(char *transa, char *transb, int m, int n, int k, 
         doublecomplex alpha, SuperMatrix *A, doublecomplex *b, int ldb, 
         doublecomplex beta, doublecomplex *c, int ldc)
{
    int    incx = 1, incy = 1;
    int    j;

    for (j = 0; j < n; ++j) {
	sp_zgemv(transa, alpha, A, &b[ldb*j], incx, beta, &c[ldc*j], incy);
    }
    return 0;    
}